

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator::GenerateHashCode
          (RepeatedImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  string_view text;
  
  text._M_str = 
  "if (get$capitalized_name$Count() > 0) {\n  hash = (37 * hash) + $constant_name$;\n  hash = (53 * hash) + get$capitalized_name$List().hashCode();\n}\n"
  ;
  text._M_len = 0x91;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,text);
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldGenerator::GenerateHashCode(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "if (get$capitalized_name$Count() > 0) {\n"
      "  hash = (37 * hash) + $constant_name$;\n"
      "  hash = (53 * hash) + get$capitalized_name$List().hashCode();\n"
      "}\n");
}